

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Array<capnp::word> * __thiscall
capnp::_::StructReader::canonicalize(Array<capnp::word> *__return_storage_ptr__,StructReader *this)

{
  word *pwVar1;
  size_t sVar2;
  MessageSizeCounts MVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<capnp::word> array;
  Array<capnp::word> backing;
  Fault f;
  DebugExpression<bool> _kjCondition;
  FlatMessageBuilder builder;
  
  MVar3 = totalSize(this);
  pwVar1 = kj::_::HeapArrayDisposer::allocate<capnp::word>(MVar3.wordCount + 1);
  sVar2 = MVar3.wordCount + 1;
  backing.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  backing.ptr = pwVar1;
  backing.size_ = sVar2;
  if (sVar2 != 0) {
    memset(pwVar1,0,sVar2 * 8);
  }
  array.size_ = sVar2;
  array.ptr = pwVar1;
  FlatMessageBuilder::FlatMessageBuilder(&builder,array);
  MessageBuilder::initRoot<capnp::AnyPointer>
            ((Builder *)&_kjCondition,&builder.super_MessageBuilder);
  PointerBuilder::setStruct((PointerBuilder *)&f,this,true);
  _kjCondition.value = MessageBuilder::isCanonical(&builder.super_MessageBuilder);
  if (_kjCondition.value) {
    AVar4 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    pwVar1 = (AVar4.ptr)->ptr;
    sVar2 = (AVar4.ptr)->size_;
    kj::heapArray<capnp::word>(__return_storage_ptr__,sVar2);
    if (sVar2 != 0) {
      memcpy(__return_storage_ptr__->ptr,pwVar1,sVar2 << 3);
    }
    FlatMessageBuilder::~FlatMessageBuilder(&builder);
    kj::Array<capnp::word>::~Array(&backing);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xbb6,FAILED,"builder.isCanonical()","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Array<word> StructReader::canonicalize() {
  auto size = totalSize().wordCount + POINTER_SIZE_IN_WORDS;
  kj::Array<word> backing = kj::heapArray<word>(unbound(size / WORDS));
  WireHelpers::zeroMemory(backing.asPtr());
  FlatMessageBuilder builder(backing);
  _::PointerHelpers<AnyPointer>::getInternalBuilder(builder.initRoot<AnyPointer>()).setStruct(*this, true);
  KJ_ASSERT(builder.isCanonical());
  auto output = builder.getSegmentsForOutput()[0];
  kj::Array<word> trunc = kj::heapArray<word>(output.size());
  WireHelpers::copyMemory(trunc.begin(), output);
  return trunc;
}